

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O3

void Abc_SclTimeNode(SC_Man *p,Abc_Obj_t *pObj,int fDept)

{
  float fVar1;
  SC_Pair SVar2;
  int iVar3;
  SC_Cell *pSVar4;
  SC_Pair *pSVar5;
  SC_Pair *pSVar6;
  void *pvVar7;
  SC_Pair *pSVar8;
  Vec_Int_t *pVVar9;
  long lVar10;
  SC_Pair *pSVar11;
  SC_Pair SVar12;
  SC_Pair SVar13;
  double dVar14;
  uint uVar15;
  Abc_Obj_t *pFanin;
  char *__function;
  Abc_Obj_t *pObj_00;
  SC_Timing *pSVar16;
  char *__file;
  ulong uVar17;
  long lVar18;
  long lVar19;
  float fVar20;
  SC_Pair ArrOut0;
  SC_Pair SlewIn;
  SC_Pair ArrIn;
  SC_Pair ArrOut1;
  SC_Pair LoadIn;
  float local_8c;
  SC_Pair local_88;
  SC_Pair local_78;
  SC_Pair local_70;
  SC_Pair local_68;
  SC_Pair local_60;
  SC_Pair local_58;
  SC_Pair local_50;
  SC_Pair local_48;
  undefined8 uStack_40;
  
  uVar17 = (ulong)(uint)pObj->Id;
  SVar2 = p->pLoads[uVar17];
  fVar20 = p->EstLoadMax;
  local_8c = 0.0;
  if ((fVar20 != 0.0) || (NAN(fVar20))) {
    local_8c = (SVar2.fall * 0.5 + SVar2.rise * 0.5) / (p->EstLoadAve * fVar20);
  }
  pSVar11 = p->pLoads + uVar17;
  uVar15 = *(uint *)&pObj->field_0x14 & 0xf;
  if ((uVar15 == 5) || (uVar15 == 2)) {
    if (fDept != 0) {
      __assert_fail("!fDept",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclSize.c"
                    ,0x142,"void Abc_SclTimeNode(SC_Man *, Abc_Obj_t *, int)");
    }
    pSVar4 = p->pPiDrive;
    if (pSVar4 == (SC_Cell *)0x0) {
      return;
    }
    pSVar5 = p->pTimes;
    pSVar6 = p->pSlews;
    local_50.rise = 0.0;
    local_50.fall = 0.0;
    local_68.rise = 0.0;
    local_68.fall = 0.0;
    local_70.rise = 0.0;
    local_70.fall = 0.0;
    local_78.rise = 0.0;
    local_78.fall = 0.0;
    local_58.rise = 0.0;
    local_58.fall = 0.0;
    local_60.rise = 0.0;
    local_60.fall = 0.0;
    pSVar8 = pSVar6 + uVar17;
    pSVar8->rise = 0.0;
    pSVar8->fall = 0.0;
    if (pSVar4->n_inputs != 1) {
      __assert_fail("pCell->n_inputs == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLib.h"
                    ,0x2af,
                    "void Scl_LibHandleInputDriver(SC_Cell *, SC_Pair *, SC_Pair *, SC_Pair *)");
    }
    if (1 < (pSVar4->vPins).nSize) {
      pvVar7 = (pSVar4->vPins).pArray[1];
      if (*(int *)((long)pvVar7 + 0x44) != 1) {
LAB_004766d3:
        __assert_fail("Vec_PtrSize(&pPin->vRTimings) == pCell->n_inputs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLib.h"
                      ,0x292,"SC_Timing *Scl_CellPinTime(SC_Cell *, int)");
      }
      lVar18 = **(long **)((long)pvVar7 + 0x48);
      iVar3 = *(int *)(lVar18 + 0xc);
      if (iVar3 == 0) {
        pSVar16 = (SC_Timing *)0x0;
      }
      else {
        if (iVar3 != 1) goto LAB_00476711;
        pSVar16 = (SC_Timing *)**(undefined8 **)(lVar18 + 0x10);
      }
      Scl_LibPinArrival(pSVar16,&local_68,&local_70,&local_50,&local_78,&local_60);
      iVar3 = pSVar4->n_inputs;
      if ((long)iVar3 < 1) {
LAB_004766f2:
        __assert_fail("iPin >= 0 && iPin < pCell->n_inputs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLib.h"
                      ,0x290,"SC_Timing *Scl_CellPinTime(SC_Cell *, int)");
      }
      if (iVar3 < (pSVar4->vPins).nSize) {
        pvVar7 = (pSVar4->vPins).pArray[iVar3];
        if (*(int *)((long)pvVar7 + 0x44) == iVar3) {
          lVar18 = **(long **)((long)pvVar7 + 0x48);
          iVar3 = *(int *)(lVar18 + 0xc);
          if (iVar3 == 0) {
            pSVar16 = (SC_Timing *)0x0;
          }
          else {
            if (iVar3 != 1) {
LAB_00476711:
              __assert_fail("Vec_PtrSize(&pRTime->vTimings) == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLib.h"
                            ,0x296,"SC_Timing *Scl_CellPinTime(SC_Cell *, int)");
            }
            pSVar16 = (SC_Timing *)**(undefined8 **)(lVar18 + 0x10);
          }
          Scl_LibPinArrival(pSVar16,&local_68,&local_70,pSVar11,&local_58,pSVar6 + uVar17);
          SVar12.fall = local_58.fall - local_78.fall;
          SVar12.rise = local_58.rise - local_78.rise;
          pSVar5[uVar17] = SVar12;
          return;
        }
        goto LAB_004766d3;
      }
    }
  }
  else {
    if (0xfffffffd < uVar15 - 5) {
      if (fDept != 0) {
        return;
      }
      p->pTimes[uVar17] =
           p->pTimes[*(uint *)((long)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray] + 0x10)];
      iVar3 = (pObj->field_5).iData;
      if ((-1 < (long)iVar3) && (iVar3 < p->vTimesOut->nSize)) {
        fVar20 = p->pTimes[(uint)pObj->Id].rise;
        fVar1 = p->pTimes[(uint)pObj->Id].fall;
        if (fVar20 <= fVar1) {
          fVar20 = fVar1;
        }
        p->vTimesOut->pArray[iVar3] = fVar20;
        Vec_QueUpdate(p->vQue,(pObj->field_5).iData);
        return;
      }
      __file = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecFlt.h"
      ;
      __function = "void Vec_FltWriteEntry(Vec_Flt_t *, int, float)";
      goto LAB_004766c9;
    }
    uStack_40 = 0;
    local_48 = SVar2;
    if (uVar15 != 7) {
      __assert_fail("Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclSize.c"
                    ,0x150,"void Abc_SclTimeNode(SC_Man *, Abc_Obj_t *, int)");
    }
    local_88.rise = 0.0;
    local_88.fall = 0.0;
    if (((fVar20 != 0.0) || (NAN(fVar20))) && (1.0 < local_8c)) {
      fVar20 = fVar20 * p->EstLoadAve;
      pSVar11->rise = fVar20;
      pSVar11->fall = fVar20;
      if (fDept == 0) {
        local_88.rise = 0.0;
        local_88.fall = 0.0;
      }
      else {
        pSVar8 = p->pDepts;
        fVar20 = p->EstLinear;
        dVar14 = log((double)local_8c);
        fVar20 = (float)(dVar14 * (double)fVar20);
        local_88 = pSVar8[uVar17];
        SVar2.fall = fVar20 + local_88.fall;
        SVar2.rise = fVar20 + local_88.rise;
        pSVar8[uVar17] = SVar2;
        uVar17 = (ulong)(uint)pObj->Id;
      }
      p->nEstNodes = p->nEstNodes + 1;
    }
    if ((int)uVar17 < 0) {
LAB_0047676e:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pVVar9 = pObj->pNtk->vGates;
    if (pVVar9->nSize <= (int)uVar17) goto LAB_0047676e;
    uVar15 = pVVar9->pArray[uVar17];
    if ((ulong)uVar15 == 0xffffffff) {
      lVar18 = 0;
LAB_0047655b:
      if (0 < (pObj->vFanins).nSize) {
        lVar19 = 0;
        do {
          iVar3 = *(int *)(lVar18 + 0x40);
          if (iVar3 <= lVar19) goto LAB_004766f2;
          if (*(int *)(lVar18 + 0x34) <= iVar3) goto LAB_004766b4;
          lVar10 = *(long *)(*(long *)(lVar18 + 0x38) + (long)iVar3 * 8);
          if (*(int *)(lVar10 + 0x44) != iVar3) goto LAB_004766d3;
          lVar10 = *(long *)(*(long *)(lVar10 + 0x48) + lVar19 * 8);
          iVar3 = *(int *)(lVar10 + 0xc);
          if (iVar3 == 0) {
            pSVar16 = (SC_Timing *)0x0;
          }
          else {
            if (iVar3 != 1) goto LAB_00476711;
            pSVar16 = (SC_Timing *)**(undefined8 **)(lVar10 + 0x10);
          }
          pObj_00 = (Abc_Obj_t *)(ulong)(uint)pObj->Id;
          pFanin = (Abc_Obj_t *)
                   (ulong)*(uint *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar19]]
                                   + 0x10);
          if (fDept == 0) {
            Scl_LibPinArrival(pSVar16,p->pTimes + (long)pFanin,p->pSlews + (long)pFanin,
                              p->pLoads + (long)pObj_00,p->pTimes + (long)pObj_00,
                              p->pSlews + (long)pObj_00);
          }
          else {
            Abc_SclDeptFanin(p,pSVar16,pObj_00,pFanin);
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 < (pObj->vFanins).nSize);
      }
      if (((p->EstLoadMax != 0.0) || (NAN(p->EstLoadMax))) && (1.0 < local_8c)) {
        *pSVar11 = local_48;
        uVar15 = pObj->Id;
        if (fDept == 0) {
          pSVar11 = p->pTimes;
          fVar20 = p->EstLinear;
          dVar14 = log((double)local_8c);
          fVar20 = (float)(dVar14 * (double)fVar20);
          SVar2 = pSVar11[uVar15];
          SVar13.fall = fVar20 + SVar2.fall;
          SVar13.rise = fVar20 + SVar2.rise;
          pSVar11[uVar15] = SVar13;
        }
        else {
          p->pDepts[uVar15] = local_88;
        }
      }
      return;
    }
    if ((-1 < (int)uVar15) &&
       (pvVar7 = pObj->pNtk->pSCLib, (int)uVar15 < *(int *)((long)pvVar7 + 100))) {
      lVar18 = *(long *)(*(long *)((long)pvVar7 + 0x68) + (ulong)uVar15 * 8);
      goto LAB_0047655b;
    }
  }
LAB_004766b4:
  __file = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h";
  __function = "void *Vec_PtrEntry(Vec_Ptr_t *, int)";
LAB_004766c9:
  __assert_fail("i >= 0 && i < p->nSize",__file,0x184,__function);
}

Assistant:

void Abc_SclTimeNode( SC_Man * p, Abc_Obj_t * pObj, int fDept )
{
    SC_Timing * pTime;
    SC_Cell * pCell;
    int k;
    SC_Pair * pLoad = Abc_SclObjLoad( p, pObj );
    float LoadRise = pLoad->rise;
    float LoadFall = pLoad->fall;
    float DeptRise = 0;
    float DeptFall = 0;
    float Value = p->EstLoadMax ? Abc_SclObjLoadValue( p, pObj ) : 0;
    Abc_Obj_t * pFanin;
    if ( Abc_ObjIsCi(pObj) )
    {
        assert( !fDept );
        Abc_SclTimeCi( p, pObj );
        return;
    }
    if ( Abc_ObjIsCo(pObj) )
    {
        if ( !fDept )
        {
            Abc_SclObjDupFanin( p, pObj );
            Vec_FltWriteEntry( p->vTimesOut, pObj->iData, Abc_SclObjTimeMax(p, pObj) );
            Vec_QueUpdate( p->vQue, pObj->iData );
        }
        return;
    }
    assert( Abc_ObjIsNode(pObj) );
//    if ( !(Abc_ObjFaninNum(pObj) == 1 && Abc_ObjIsPi(Abc_ObjFanin0(pObj))) && p->EstLoadMax && Value > 1 )
    if ( p->EstLoadMax && Value > 1 )
    {
        pLoad->rise = p->EstLoadAve * p->EstLoadMax;
        pLoad->fall = p->EstLoadAve * p->EstLoadMax;
        if ( fDept )
        {
            SC_Pair * pDepOut  = Abc_SclObjDept( p, pObj );
            float EstDelta = p->EstLinear * log( Value );
            DeptRise = pDepOut->rise;
            DeptFall = pDepOut->fall;
            pDepOut->rise += EstDelta;
            pDepOut->fall += EstDelta;
        }
        p->nEstNodes++;
    }
    // get the library cell
    pCell = Abc_SclObjCell( pObj );
    // compute for each fanin
    Abc_ObjForEachFanin( pObj, pFanin, k )
    {
        pTime = Scl_CellPinTime( pCell, k );
        if ( fDept )
            Abc_SclDeptFanin( p, pTime, pObj, pFanin );
        else
            Abc_SclTimeFanin( p, pTime, pObj, pFanin );
    }
    if ( p->EstLoadMax && Value > 1 )
    {
        pLoad->rise = LoadRise;
        pLoad->fall = LoadFall;
        if ( fDept )
        {
            SC_Pair * pDepOut  = Abc_SclObjDept( p, pObj );
            pDepOut->rise = DeptRise;
            pDepOut->fall = DeptFall;
        }
        else
        {
            SC_Pair * pArrOut  = Abc_SclObjTime( p, pObj );
            float EstDelta = p->EstLinear * log( Value );
            pArrOut->rise += EstDelta;
            pArrOut->fall += EstDelta;
        }
    }
}